

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferSubDataUploadCase::init
          (BufferSubDataUploadCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  char *pcVar2;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  
  local_190.m_log =
       ((this->
        super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
        ).
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
        .super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &local_190.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Testing glBufferSubData() function call performance. ");
  pcVar2 = "Half of the buffer data is updated with glBufferSubData. ";
  if (this->m_fullUpload != false) {
    pcVar2 = "The whole buffer is updated with glBufferSubData. ";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  pcVar2 = "";
  if (this->m_invalidateBeforeUse != false) {
    pcVar2 = "The buffer is cleared with glBufferData(..., NULL) before glBufferSubData upload.";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,"\n");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ::init(&this->
                  super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void BufferSubDataUploadCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing glBufferSubData() function call performance. "
		<< ((m_fullUpload) ? ("The whole buffer is updated with glBufferSubData. ") : ("Half of the buffer data is updated with glBufferSubData. "))
		<< ((m_invalidateBeforeUse) ? ("The buffer is cleared with glBufferData(..., NULL) before glBufferSubData upload.") : ("")) << "\n"
		<< tcu::TestLog::EndMessage;

	BasicUploadCase<SingleOperationDuration>::init();
}